

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

void Gia_ManPrintEquivs(Gia_Man_t *p)

{
  int iVar1;
  bool bVar2;
  uint local_20;
  uint local_1c;
  int iObj;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  printf("Const0:");
  local_1c = 0;
  while( true ) {
    bVar2 = false;
    if ((int)local_1c < p->nObjs) {
      _iObj = Gia_ManObj(p,local_1c);
      bVar2 = _iObj != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(_iObj);
    if ((iVar1 != 0) && (iVar1 = Gia_ObjRepr(p,local_1c), iVar1 == 0)) {
      printf(" %d",(ulong)local_1c);
    }
    local_1c = local_1c + 1;
  }
  printf("\n");
  local_1c = 1;
  do {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= (int)local_1c) {
      return;
    }
    iVar1 = Gia_ObjIsHead(p,local_1c);
    if (iVar1 != 0) {
      printf("%d:",(ulong)local_1c);
      iVar1 = Gia_ObjIsHead(p,local_1c);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsHead(p, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                      ,0x12ba,"void Gia_ManPrintEquivs(Gia_Man_t *)");
      }
      for (local_20 = Gia_ObjNext(p,local_1c); 0 < (int)local_20; local_20 = Gia_ObjNext(p,local_20)
          ) {
        printf(" %d",(ulong)local_20);
      }
      printf("\n");
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void Gia_ManPrintEquivs( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; int i, iObj;
    printf( "Const0:" );
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjRepr(p, i) == 0 )
            printf( " %d", i );
    printf( "\n" );
    Gia_ManForEachClass( p, i )
    {
        printf( "%d:", i );
        Gia_ClassForEachObj1( p, i, iObj )
            printf( " %d", iObj );
        printf( "\n" );
    }
}